

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  int *piVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  pointer piVar4;
  iterator __position;
  char cVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ostream *poVar11;
  long *plVar12;
  size_t sVar13;
  pointer pbVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  mapped_type *this_00;
  long lVar16;
  long *plVar17;
  size_type *psVar18;
  bool collapse;
  ulong uVar19;
  int retVal;
  string lcovFile;
  string nl;
  string actualSourceFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string lineNumber;
  string output;
  string command;
  string srcname;
  string errors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string daGlob;
  string sourceFile;
  string dir;
  string fileDir;
  string st2lcovOutputRex3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string tempDir;
  string lcovExtraFlags;
  string lcovCommand;
  ostringstream cmCTestLog_msg_14;
  ostringstream cmCTestLog_msg;
  string testingDir;
  ostringstream cmCTestLog_msg_20;
  string currentDirectory;
  cmCTestCoverageHandlerLocale locale_C;
  Glob gl;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  RegularExpression st2re3;
  undefined1 auStack_a18 [14];
  byte local_a0a;
  char local_a09;
  int local_a08;
  int local_a04;
  cmCTestCoverageHandlerContainer *local_a00;
  int local_9f4;
  string *local_9f0;
  char *local_9e8;
  long local_9e0;
  char local_9d8;
  undefined7 uStack_9d7;
  string local_9c8;
  key_type local_9a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_988;
  long *local_970 [2];
  long local_960 [2];
  int local_94c;
  string local_948;
  long *local_928;
  long local_920;
  long local_918;
  long lStack_910;
  string local_908;
  string local_8e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c8;
  string local_8a8;
  char *local_888;
  long local_880;
  char local_878;
  undefined7 uStack_877;
  undefined1 *local_868;
  undefined8 local_860;
  undefined1 local_858;
  undefined7 uStack_857;
  string local_848;
  long *local_828 [2];
  long local_818 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_808;
  long *local_7e8 [2];
  long local_7d8 [2];
  string local_7c8;
  string local_7a8;
  long *local_788;
  long local_780;
  long local_778;
  long lStack_770;
  byte abStack_768 [80];
  ios_base local_718 [408];
  undefined1 local_580 [32];
  byte abStack_560 [80];
  ios_base local_510 [408];
  pointer local_378;
  TotalCoverageMap *local_370;
  pointer local_368;
  string local_360;
  undefined1 local_340 [112];
  ios_base local_2d0 [264];
  string local_1c8;
  cmCTestCoverageHandlerLocale local_1a8;
  Glob local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  RegularExpression local_100;
  
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  pcVar2 = local_580 + 0x10;
  local_a00 = cont;
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"CoverageCommand","");
  cmCTest::GetCTestConfiguration(&local_7a8,pcVar3,(string *)local_580);
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"CoverageExtraFlags","");
  cmCTest::GetCTestConfiguration(&local_7c8,pcVar3,(string *)local_580);
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_7a8);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_580," Not a valid Intel Coverage command.",0x24);
    std::ios::widen((char)(ostream *)local_580 + (char)*(undefined8 *)(local_580._0_8_ + -0x18));
    std::ostream::put((char)local_580);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5d3,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
    if (local_788 != &local_778) {
      operator_delete(local_788,local_778 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    iVar8 = 0;
    goto LAB_0028439b;
  }
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"[0-9]+%","");
  local_100.program = (char *)0x0;
  if (local_828[0] != (long *)0x0) {
    cmsys::RegularExpression::compile(&local_100,(char *)local_828[0]);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_580," This is coverage command: ",0x1b);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,local_7a8._M_dataplus._M_p,local_7a8._M_string_length);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x5dc,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
  if (local_788 != &local_778) {
    operator_delete(local_788,local_778 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
  std::ios_base::~ios_base(local_510);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_580," These are coverage command flags: ",0x23);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x5e0,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
  if (local_788 != &local_778) {
    operator_delete(local_788,local_778 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
  std::ios_base::~ios_base(local_510);
  local_8c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_8c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_8c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = FindLCovFiles(this,&local_8c8);
  if (bVar7) {
    if (local_8c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_8c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_580," Cannot find any LCov coverage files.",0x25);
      std::ios::widen((char)(ostream *)local_580 + (char)*(undefined8 *)(local_580._0_8_ + -0x18));
      std::ostream::put((char)local_580);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x5ef,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
      goto LAB_00284252;
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&local_360,(this->super_cmCTestGenericHandler).CTest);
    local_7e8[0] = local_7d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_7e8,local_360._M_dataplus._M_p,
               local_360._M_dataplus._M_p + local_360._M_string_length);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_1c8,(SystemTools *)&DAT_00000001,collapse);
    local_130._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_130._M_impl.super__Rb_tree_header._M_header;
    local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
    local_130._M_impl.super__Rb_tree_header._M_header._M_right =
         local_130._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_580,"   Processing coverage (each . represents one file):",0x34);
    std::ios::widen((char)(ostream *)local_580 + (char)*(undefined8 *)(local_580._0_8_ + -0x18));
    std::ostream::put((char)local_580);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5fc,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
    if (local_788 != &local_778) {
      operator_delete(local_788,local_778 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_580,"    ",4);
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5fd,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
    if (local_788 != &local_778) {
      operator_delete(local_788,local_778 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&local_1a8);
    local_9f0 = local_8c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (local_8c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_8c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_a08 = 0;
    }
    else {
      local_370 = &local_a00->TotalCoverage;
      local_a08 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_580,".",1);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x609,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
        if (local_788 != &local_778) {
          operator_delete(local_788,local_778 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
        std::ios_base::~ios_base(local_510);
        cmsys::SystemTools::GetFilenamePath(&local_848,local_9f0);
        cmsys::SystemTools::ChangeDirectory(&local_848);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_340,"\"",&local_7a8);
        plVar12 = (long *)std::__cxx11::string::append((char *)local_340);
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_778 = *plVar17;
          lStack_770 = plVar12[3];
          local_788 = &local_778;
        }
        else {
          local_778 = *plVar17;
          local_788 = (long *)*plVar12;
        }
        local_780 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_788,(ulong)local_7c8._M_dataplus._M_p);
        psVar18 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar18) {
          local_580._16_8_ = *psVar18;
          local_580._24_8_ = plVar12[3];
          local_580._0_8_ = local_580 + 0x10;
        }
        else {
          local_580._16_8_ = *psVar18;
          local_580._0_8_ = (size_type *)*plVar12;
        }
        local_580._8_8_ = plVar12[1];
        *plVar12 = (long)psVar18;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)local_580);
        local_928 = &local_918;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_918 = *plVar17;
          lStack_910 = plVar12[3];
        }
        else {
          local_918 = *plVar17;
          local_928 = (long *)*plVar12;
        }
        local_920 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((undefined1 *)local_580._0_8_ != local_580 + 0x10) {
          operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
        }
        if (local_788 != &local_778) {
          operator_delete(local_788,local_778 + 1);
        }
        if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
          operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_580,"Current coverage dir: ",0x16);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_580,local_848._M_dataplus._M_p,
                             local_848._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x610,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
        if (local_788 != &local_778) {
          operator_delete(local_788,local_778 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
        std::ios_base::~ios_base(local_510);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
        plVar12 = local_928;
        if (local_928 == (long *)0x0) {
          std::ios::clear((int)auStack_a18 + (int)*(undefined8 *)(local_580._0_8_ + -0x18) + 0x498);
        }
        else {
          sVar13 = strlen((char *)local_928);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_580,(char *)plVar12,sVar13);
        }
        cVar5 = (char)(string *)local_580;
        std::ios::widen((char)*(undefined8 *)(local_580._0_8_ + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x612,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
        if (local_788 != &local_778) {
          operator_delete(local_788,local_778 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
        std::ios_base::~ios_base(local_510);
        local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"","");
        local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"","");
        local_9f4 = 0;
        poVar11 = local_a00->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"* Run coverage for: ",0x14);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_848._M_dataplus._M_p,local_848._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        poVar11 = local_a00->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  Command: ",0xb);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(char *)local_928,local_920);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        bVar7 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,(char *)local_928,
                                    &local_948,&local_8e8,&local_9f4,local_848._M_dataplus._M_p,0.0)
        ;
        poVar11 = local_a00->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  Output: ",10);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_948._M_dataplus._M_p,local_948._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        poVar11 = local_a00->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  Errors: ",10);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_8e8._M_dataplus._M_p,local_8e8._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if (bVar7) {
          if (local_9f4 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,"Coverage command returned: ",0x1b);
            poVar11 = (ostream *)std::ostream::operator<<((string *)local_580,local_9f4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," while processing: ",0x13);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(local_9f0->_M_dataplus)._M_p,local_9f0->_M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x62a,(char *)local_788,false);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,"Command produced error: ",0x18);
            plVar12 = (long *)std::ostream::operator<<((string *)local_580,local_a00->Error);
            std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
            std::ostream::put((char)plVar12);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x62c,(char *)local_788,false);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_580,
                     "--------------------------------------------------------------",0x3e);
          std::ios::widen((char)*(undefined8 *)(local_580._0_8_ + -0x18) + cVar5);
          std::ostream::put(cVar5);
          poVar11 = (ostream *)std::ostream::flush();
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_948._M_dataplus._M_p,local_948._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          poVar11 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"--------------------------------------------------------------",0x3e);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x633,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
          if (local_788 != &local_778) {
            operator_delete(local_788,local_778 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
          std::ios_base::~ios_base(local_510);
          local_808.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_808.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_808.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::Split(local_948._M_dataplus._M_p,&local_808);
          pbVar14 = local_808.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            if (pbVar14 ==
                local_808.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) break;
            local_888 = &local_878;
            local_880 = 0;
            local_878 = '\0';
            local_9e8 = &local_9d8;
            local_9e0 = 0;
            local_9d8 = '\0';
            local_378 = pbVar14;
            cmsys::Glob::Glob(&local_188);
            local_188.Recurse = true;
            local_188.RecurseThroughSymlinks = false;
            local_868 = &local_858;
            local_860 = 0;
            local_858 = 0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmCTest::GetBinaryDir_abi_cxx11_
                      ((string *)local_580,(this->super_cmCTestGenericHandler).CTest);
            std::__cxx11::string::operator=((string *)&local_868,(string *)local_580);
            if ((undefined1 *)local_580._0_8_ != local_580 + 0x10) {
              operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
            }
            local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
            local_8a8._M_string_length = 0;
            local_8a8.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)&local_8a8);
            std::__cxx11::string::append((char *)&local_8a8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,"   looking for LCOV files in: ",0x1e);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_580,local_8a8._M_dataplus._M_p,
                                 local_8a8._M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x650,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
            cmsys::Glob::FindFiles(&local_188,&local_8a8,(GlobMessages *)0x0);
            pbVar6 = local_988.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pvVar15 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
            pbVar14 = (pvVar15->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pvVar15 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_988,pbVar6,pbVar14,
                       (pvVar15->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
            local_a04 = 0;
            pbVar14 = local_988.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while (local_a0a = pbVar14 ==
                               local_988.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish, !(bool)local_a0a) {
              local_368 = pbVar14;
              std::__cxx11::string::_M_assign((string *)&local_9e8);
              std::ifstream::ifstream((string *)local_580,local_9e8,_S_in);
              if ((abStack_560[*(long *)(local_580._0_8_ + -0x18)] & 5) != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_788,"Cannot open file: ",0x12);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_788,local_9e8,local_9e0);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x65e,(char *)local_340._0_8_,false);
                if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                std::ios_base::~ios_base(local_718);
              }
              local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
              local_908._M_string_length = 0;
              local_908.field_2._M_local_buf[0] = '\0';
              local_a09 = cmsys::SystemTools::GetLineFromStream
                                    ((istream *)local_580,&local_908,(bool *)0x0,-1);
              if ((bool)local_a09) {
                std::__cxx11::string::substr((ulong)&local_788,(ulong)&local_908);
                std::__cxx11::string::operator=((string *)&local_908,(string *)&local_788);
                if (local_788 != &local_778) {
                  operator_delete(local_788,local_778 + 1);
                }
                std::__cxx11::string::_M_assign((string *)&local_888);
                std::__cxx11::string::_M_assign((string *)&local_9a8);
                for (pbVar14 = local_988.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pbVar14 !=
                    local_988.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_788,"Found LCOV File: ",0x11);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_788,(pbVar14->_M_dataplus)._M_p,
                                       pbVar14->_M_string_length);
                  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                  std::ostream::put((char)poVar11);
                  std::ostream::flush();
                  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar3,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x674,(char *)local_340._0_8_,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                  std::ios_base::~ios_base(local_718);
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_788,"SourceFile: ",0xc);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_788,local_888,local_880);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x677,(char *)local_340._0_8_,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                std::ios_base::~ios_base(local_718);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_788,"lCovFile: ",10);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_788,local_9e8,local_9e0);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x679,(char *)local_340._0_8_,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                std::ios_base::~ios_base(local_718);
                if ((local_9e0 != 0) && ((char *)local_9a8._M_string_length != (char *)0x0)) {
                  this_00 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                            ::operator[](local_370,&local_9a8);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_788,"   in lcovFile: ",0x10);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_788,local_9e8,local_9e0);
                  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                  std::ostream::put((char)poVar11);
                  std::ostream::flush();
                  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar3,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x682,(char *)local_340._0_8_,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                  std::ios_base::~ios_base(local_718);
                  std::ifstream::ifstream((ostringstream *)&local_788,local_9e8,_S_in);
                  if ((abStack_768[local_788[-3]] & 5) == 0) {
                    local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
                    local_9c8._M_string_length = 0;
                    local_9c8.field_2._M_local_buf[0] = '\0';
                    cmsys::SystemTools::GetLineFromStream
                              ((istream *)&local_788,&local_9c8,(bool *)0x0,-1);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_340,"File is ready, start reading.",0x1d);
                    std::ios::widen((char)*(undefined8 *)(local_340._0_8_ + -0x18) + (char)local_340
                                   );
                    std::ostream::put((char)local_340);
                    std::ostream::flush();
                    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar3,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x692,(char *)local_970[0],
                                 (this->super_cmCTestGenericHandler).Quiet);
                    if (local_970[0] != local_960) {
                      operator_delete(local_970[0],local_960[0] + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
                    std::ios_base::~ios_base(local_2d0);
                    while (bVar7 = cmsys::SystemTools::GetLineFromStream
                                             ((istream *)&local_788,&local_9c8,(bool *)0x0,-1),
                          bVar7) {
                      if (0xb < local_9c8._M_string_length) {
                        std::__cxx11::string::substr((ulong)local_340,(ulong)&local_9c8);
                        iVar8 = atoi((char *)local_340._0_8_);
                        std::__cxx11::string::substr((ulong)local_970,(ulong)&local_9c8);
                        iVar9 = atoi((char *)local_970[0]);
                        if (0 < iVar9) {
                          uVar19 = (ulong)(iVar9 + -1);
                          while( true ) {
                            piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_start;
                            __position._M_current =
                                 (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (uVar19 < (ulong)((long)__position._M_current - (long)piVar4 >> 2))
                            break;
                            local_94c = -1;
                            if (__position._M_current ==
                                (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                        (this_00,__position,&local_94c);
                            }
                            else {
                              *__position._M_current = -1;
                              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = __position._M_current + 1;
                            }
                          }
                          if ((piVar4[uVar19] < 0) &&
                             ((0 < iVar8 ||
                              (lVar16 = std::__cxx11::string::find(local_340,0x59fb61,0),
                              lVar16 != -1)))) {
                            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar19] = 0;
                          }
                          piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + uVar19;
                          *piVar1 = *piVar1 + iVar8;
                        }
                        if (local_970[0] != local_960) {
                          operator_delete(local_970[0],local_960[0] + 1);
                        }
                        if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                          operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                        }
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
                      operator_delete(local_9c8._M_dataplus._M_p,
                                      CONCAT71(local_9c8.field_2._M_allocated_capacity._1_7_,
                                               local_9c8.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_340,"Cannot open file: ",0x12);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_340,local_9e8,local_9e0);
                    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                    std::ostream::put((char)poVar11);
                    std::ostream::flush();
                    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar3,6,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x688,local_9c8._M_dataplus._M_p,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
                      operator_delete(local_9c8._M_dataplus._M_p,
                                      CONCAT71(local_9c8.field_2._M_allocated_capacity._1_7_,
                                               local_9c8.field_2._M_local_buf[0]) + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
                    std::ios_base::~ios_base(local_2d0);
                  }
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_9a8,0,(char *)local_9a8._M_string_length,0x5fa2a3);
                  std::ifstream::~ifstream((ostringstream *)&local_788);
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_788,"Error while parsing lcov file \'",0x1f);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_788,local_9e8,local_9e0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\':",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," No source file name found!",0x1b);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x667,(char *)local_340._0_8_,false);
                if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                std::ios_base::~ios_base(local_718);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_908._M_dataplus._M_p != &local_908.field_2) {
                operator_delete(local_908._M_dataplus._M_p,
                                CONCAT71(local_908.field_2._M_allocated_capacity._1_7_,
                                         local_908.field_2._M_local_buf[0]) + 1);
              }
              std::ifstream::~ifstream((string *)local_580);
              if (local_a09 == '\0') {
                local_a04 = 1;
                break;
              }
              pbVar14 = local_368 + 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
              operator_delete(local_8a8._M_dataplus._M_p,
                              CONCAT71(local_8a8.field_2._M_allocated_capacity._1_7_,
                                       local_8a8.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_988);
            if (local_868 != &local_858) {
              operator_delete(local_868,CONCAT71(uStack_857,local_858) + 1);
            }
            cmsys::Glob::~Glob(&local_188);
            if (local_9e8 != &local_9d8) {
              operator_delete(local_9e8,CONCAT71(uStack_9d7,local_9d8) + 1);
            }
            if (local_888 != &local_878) {
              operator_delete(local_888,CONCAT71(uStack_877,local_878) + 1);
            }
            if ((local_a0a & 1) == 0) goto LAB_0028407e;
            pbVar14 = local_378 + 1;
          }
          iVar8 = local_a08 * -0x3d70a3d7;
          local_a08 = local_a08 + 1;
          uVar10 = iVar8 + 0xc7ae1479;
          local_a04 = 0;
          if ((uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f) < 0x51eb851) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580," processed: ",0xc);
            poVar11 = (ostream *)std::ostream::operator<<((string *)local_580,local_a08);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," out of ",8);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x6ce,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_580,"    ",4);
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x6cf,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
          }
LAB_0028407e:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_808);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_580,"Problem running coverage on file: ",0x22);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_580,(local_9f0->_M_dataplus)._M_p,
                               local_9f0->_M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x621,(char *)local_788,false);
          if (local_788 != &local_778) {
            operator_delete(local_788,local_778 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
          std::ios_base::~ios_base(local_510);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_580,"Command produced error: ",0x18);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_580,local_8e8._M_dataplus._M_p,
                               local_8e8._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x623,(char *)local_788,false);
          if (local_788 != &local_778) {
            operator_delete(local_788,local_778 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
          std::ios_base::~ios_base(local_510);
          local_a00->Error = local_a00->Error + 1;
          local_a04 = 0x12;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
          operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_948._M_dataplus._M_p != &local_948.field_2) {
          operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
        }
        if (local_928 != &local_918) {
          operator_delete(local_928,local_918 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_848._M_dataplus._M_p != &local_848.field_2) {
          operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
        }
        if ((local_a04 != 0x12) && (local_a04 != 0)) {
          iVar8 = 0;
          goto LAB_002842b4;
        }
        local_9f0 = local_9f0 + 1;
      } while (local_9f0 !=
               local_8c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmsys::SystemTools::ChangeDirectory(&local_1c8);
    iVar8 = local_a08;
LAB_002842b4:
    cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
      operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_7e8[0] != local_7d8) {
      operator_delete(local_7e8[0],local_7d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_580,"Error while finding LCov files.\n",0x20);
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x5e6,(char *)local_788,false);
LAB_00284252:
    if (local_788 != &local_778) {
      operator_delete(local_788,local_778 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    iVar8 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8c8);
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0],local_818[0] + 1);
  }
LAB_0028439b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  return iVar8;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand
    = this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags
    = this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if ( lcovCommand != "codecov" )
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               " Not a valid Intel Coverage command."
               << std::endl, this->Quiet);
    return 0;
    }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    " This is coverage command: " << lcovCommand
    << std::endl, this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    " These are coverage command flags: " << lcovExtraFlags
    << std::endl, this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
    }
  std::vector<std::string>::iterator it;

  if (files.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      " Cannot find any LCov coverage files."
      << std::endl, this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
    }
  std::string testingDir = this->CTest->GetBinaryDir();
  std::string tempDir = testingDir;
  std::string currentDirectory = cmSystemTools::GetCurrentWorkingDirectory();

  std::set<std::string> missingFiles;

  std::string actualSourceFile = "";
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for ( it = files.begin(); it != files.end(); ++ it )
    {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
      this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(*it);
    cmSystemTools::ChangeDirectory(fileDir);
    std::string command = "\"" + lcovCommand + "\" " +
      lcovExtraFlags + " ";

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "Current coverage dir: " << fileDir << std::endl, this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, command.c_str()
      << std::endl, this->Quiet);

    std::string output = "";
    std::string errors = "";
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res = this->CTest->RunCommand(command.c_str(), &output, &errors,
                &retVal, fileDir.c_str(), 0 /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if ( ! res )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Problem running coverage on file: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Command produced error: " << errors << std::endl);
      cont->Error ++;
      continue;
      }
    if ( retVal != 0 )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Coverage command returned: "
        << retVal << " while processing: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Command produced error: " << cont->Error << std::endl);
      }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
      << std::endl
      << output << std::endl
      << "--------------------------------------------------------------"
      << std::endl, this->Quiet);

    std::vector<std::string> lines;
    std::vector<std::string>::iterator line;

    cmSystemTools::Split(output.c_str(), lines);

    for ( line = lines.begin(); line != lines.end(); ++line)
      {
      std::string sourceFile;
      std::string lcovFile;

      if (line->empty())
        {
        // Ignore empty line
        }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      lcovFiles.insert(lcovFiles.end(), gl.GetFiles().begin(),
                       gl.GetFiles().end());

      for(std::vector<std::string>::iterator a = lcovFiles.begin();
          a != lcovFiles.end(); ++a)
        {
        lcovFile = *a;
        cmsys::ifstream srcead(lcovFile.c_str());
        if ( ! srcead )
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open file: "
                     << lcovFile << std::endl);
          }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if ( !success )
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '" << lcovFile << "':"
                     << " No source file name found!" << std::endl);
          return 0;
          }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for(std::vector<std::string>::iterator t = lcovFiles.begin();
            t != lcovFiles.end(); ++t)
          {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
            "Found LCOV File: " << *t << std::endl, this->Quiet);
          }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "SourceFile: "
          << sourceFile << std::endl, this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "lCovFile: "
        << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if ( !lcovFile.empty() && !actualSourceFile.empty() )
          {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec
            = cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
            "   in lcovFile: " << lcovFile << std::endl, this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if ( ! ifile )
            {
            cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open file: "
                       << lcovFile << std::endl);
            }
          else
            {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
              "File is ready, start reading." << std::endl, this->Quiet);
            while ( cmSystemTools::GetLineFromStream(ifile, nl) )
              {
              cnt ++;

              // Skip empty lines
              if (nl.empty())
                {
                continue;
                }

              // Skip unused lines
              if ( nl.size() < 12 )
                {
                continue;
                }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str())-1;
              if ( lineIdx >= 0 )
                {
                while ( vec.size() <= static_cast<size_t>(lineIdx) )
                  {
                  vec.push_back(-1);
                  }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if ( vec[lineIdx] < 0 )
                  {
                  if ( cov > 0 || prefix.find("#") != prefix.npos )
                    {
                    vec[lineIdx] = 0;
                    }
                  }

                vec[lineIdx] += cov;
                }
              }
            }

          actualSourceFile = "";
          }
        }
      }

    file_count++;

    if ( file_count % 50 == 0 )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
        " processed: " << file_count << " out of " << files.size()
        << std::endl, this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
      }
    }

  cmSystemTools::ChangeDirectory(currentDirectory);
  return file_count;
}